

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetPolicyNode::Evaluate
          (string *__return_storage_ptr__,TargetPolicyNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  string *psVar1;
  bool bVar2;
  PolicyStatus PVar3;
  PolicyID PVar4;
  cmLocalGenerator *this_00;
  PolicyID id;
  char *pcVar5;
  long lVar6;
  allocator local_81;
  string *local_80;
  string local_78;
  GeneratorExpressionContent *local_58;
  string local_50;
  
  if (context->HeadTarget == (cmGeneratorTarget *)0x0) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_78,content);
    std::__cxx11::string::string
              ((string *)&local_50,
               "$<TARGET_POLICY:prop> may only be used with binary targets.  It may not be used with add_custom_command or add_custom_target."
               ,&local_81);
    reportError(context,&local_78,&local_50);
  }
  else {
    context->HadContextSensitiveCondition = true;
    context->HadHeadSensitiveCondition = true;
    local_80 = __return_storage_ptr__;
    local_58 = content;
    for (lVar6 = 1; lVar6 != 0x12; lVar6 = lVar6 + 1) {
      pcVar5 = targetPolicyWhitelist[lVar6];
      bVar2 = std::operator==((parameters->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start,pcVar5);
      if (bVar2) {
        this_00 = cmGeneratorTarget::GetLocalGenerator(context->HeadTarget);
        PVar3 = statusForTarget(context->HeadTarget,pcVar5);
        switch(PVar3) {
        case WARN:
          PVar4 = policyForString(pcVar5);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_78,(cmPolicies *)(ulong)PVar4,id);
          cmLocalGenerator::IssueMessage(this_00,AUTHOR_WARNING,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
        case OLD:
        case REQUIRED_IF_USED:
        case REQUIRED_ALWAYS:
          pcVar5 = "0";
          break;
        case NEW:
          pcVar5 = "1";
          break;
        default:
          goto switchD_00415c02_default;
        }
        psVar1 = local_80;
        std::__cxx11::string::string((string *)local_80,pcVar5,(allocator *)&local_78);
        return psVar1;
      }
switchD_00415c02_default:
    }
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_78,local_58);
    std::__cxx11::string::string
              ((string *)&local_50,
               "$<TARGET_POLICY:prop> may only be used with a limited number of policies.  Currently it may be used with the following policies:\n * CMP0003\n * CMP0004\n * CMP0008\n * CMP0020\n * CMP0021\n * CMP0022\n * CMP0027\n * CMP0038\n * CMP0041\n * CMP0042\n * CMP0046\n * CMP0052\n * CMP0060\n * CMP0063\n * CMP0065\n * CMP0068\n * CMP0069\n"
               ,&local_81);
    __return_storage_ptr__ = local_80;
    reportError(context,&local_78,&local_50);
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_78);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string>& parameters,
                       cmGeneratorExpressionContext* context,
                       const GeneratorExpressionContent* content,
                       cmGeneratorExpressionDAGChecker* /*dagChecker*/) const
    CM_OVERRIDE
  {
    if (!context->HeadTarget) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_POLICY:prop> may only be used with binary targets.  It "
        "may not be used with add_custom_command or add_custom_target.");
      return std::string();
    }

    context->HadContextSensitiveCondition = true;
    context->HadHeadSensitiveCondition = true;

    for (size_t i = 1; i < cmArraySize(targetPolicyWhitelist); ++i) {
      const char* policy = targetPolicyWhitelist[i];
      if (parameters.front() == policy) {
        cmLocalGenerator* lg = context->HeadTarget->GetLocalGenerator();
        switch (statusForTarget(context->HeadTarget, policy)) {
          case cmPolicies::WARN:
            lg->IssueMessage(
              cmake::AUTHOR_WARNING,
              cmPolicies::GetPolicyWarning(policyForString(policy)));
            CM_FALLTHROUGH;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::OLD:
            return "0";
          case cmPolicies::NEW:
            return "1";
        }
      }
    }
    reportError(
      context, content->GetOriginalExpression(),
      "$<TARGET_POLICY:prop> may only be used with a limited number of "
      "policies.  Currently it may be used with the following policies:\n"

#define STRINGIFY_HELPER(X) #X
#define STRINGIFY(X) STRINGIFY_HELPER(X)

#define TARGET_POLICY_LIST_ITEM(POLICY) " * " STRINGIFY(POLICY) "\n"

      CM_FOR_EACH_TARGET_POLICY(TARGET_POLICY_LIST_ITEM)

#undef TARGET_POLICY_LIST_ITEM
        );
    return std::string();
  }